

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFrom(void *value)

{
  size_t extraout_RDX;
  SimpleString *in_RDI;
  SimpleString SVar1;
  char *in_stack_ffffffffffffffa8;
  SimpleString *in_stack_ffffffffffffffd0;
  SimpleString *in_stack_ffffffffffffffd8;
  
  SimpleString::SimpleString(in_RDI,in_stack_ffffffffffffffa8);
  HexStringFrom(in_stack_ffffffffffffffa8);
  SimpleString::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  SimpleString::~SimpleString((SimpleString *)0x1125ad);
  SimpleString::~SimpleString((SimpleString *)0x1125b7);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)in_RDI;
  return SVar1;
}

Assistant:

SimpleString StringFrom(const void* value)
{
    return SimpleString("0x") + HexStringFrom(value);
}